

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O1

encryption_method_e
QPDF::interpretCF(shared_ptr<QPDF::EncryptionParameters> *encp,QPDFObjectHandle *cf)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  mapped_type *pmVar5;
  encryption_method_e eVar6;
  string filter;
  string local_40;
  
  bVar2 = QPDFObjectHandle::isName(cf);
  eVar6 = e_none;
  if (bVar2) {
    QPDFObjectHandle::getName_abi_cxx11_(&local_40,cf);
    peVar1 = (encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e>_>_>
            ::find(&(peVar1->crypt_filters)._M_t,&local_40);
    if ((_Rb_tree_header *)cVar4._M_node ==
        &(peVar1->crypt_filters)._M_t._M_impl.super__Rb_tree_header) {
      iVar3 = std::__cxx11::string::compare((char *)&local_40);
      eVar6 = (encryption_method_e)(iVar3 != 0);
    }
    else {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e>_>_>
               ::operator[](&((encp->
                              super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr)->crypt_filters,&local_40);
      eVar6 = *pmVar5;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return eVar6;
}

Assistant:

QPDF::encryption_method_e
QPDF::interpretCF(std::shared_ptr<EncryptionParameters> encp, QPDFObjectHandle cf)
{
    if (cf.isName()) {
        std::string filter = cf.getName();
        if (encp->crypt_filters.count(filter) != 0) {
            return encp->crypt_filters[filter];
        } else if (filter == "/Identity") {
            return e_none;
        } else {
            return e_unknown;
        }
    } else {
        // Default: /Identity
        return e_none;
    }
}